

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_ls.c
# Opt level: O1

int kinLs_AccessLMem(void *kinmem,char *fname,KINMem *kin_mem,KINLsMem *kinls_mem)

{
  int line;
  int iVar1;
  int error_code;
  char *msgfmt;
  
  if (kinmem == (void *)0x0) {
    msgfmt = "KINSOL memory is NULL.";
    iVar1 = -1;
    kinmem = (KINMem)0x0;
    error_code = -1;
    line = 0x577;
  }
  else {
    *kin_mem = (KINMem)kinmem;
    if (*(KINLsMem *)((long)kinmem + 0x248) != (KINLsMem)0x0) {
      *kinls_mem = *(KINLsMem *)((long)kinmem + 0x248);
      return 0;
    }
    msgfmt = "Linear solver memory is NULL.";
    iVar1 = -2;
    error_code = -2;
    line = 0x57e;
  }
  KINProcessError((KINMem)kinmem,error_code,line,fname,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_ls.c"
                  ,msgfmt);
  return iVar1;
}

Assistant:

int kinLs_AccessLMem(void* kinmem, const char* fname, KINMem* kin_mem,
                     KINLsMem* kinls_mem)
{
  if (kinmem == NULL)
  {
    KINProcessError(NULL, KINLS_MEM_NULL, __LINE__, fname, __FILE__,
                    MSG_LS_KINMEM_NULL);
    return (KINLS_MEM_NULL);
  }
  *kin_mem = (KINMem)kinmem;
  if ((*kin_mem)->kin_lmem == NULL)
  {
    KINProcessError(*kin_mem, KINLS_LMEM_NULL, __LINE__, fname, __FILE__,
                    MSG_LS_LMEM_NULL);
    return (KINLS_LMEM_NULL);
  }
  *kinls_mem = (KINLsMem)(*kin_mem)->kin_lmem;
  return (KINLS_SUCCESS);
}